

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::parseLine
          (FluctuatingChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  ForceFieldOptions *pFVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type_conflict *pmVar5;
  char *__format;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_00;
  _Rb_tree_color _Var6;
  uint uVar7;
  RealType RVar8;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  string atomTypeName;
  StringTokenizer tokenizer;
  FluctuatingChargeAdapter local_180;
  double local_178;
  RealType local_170;
  double local_168;
  double local_160;
  AtomType *local_158;
  undefined1 local_150 [16];
  undefined1 local_140 [56];
  string local_108;
  StringTokenizer local_e8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  local_150._0_8_ = (AtomType *)local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_e8,line,(string *)local_150);
  if ((AtomType *)local_150._0_8_ != (AtomType *)local_140) {
    operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
  }
  iVar3 = StringTokenizer::countTokens(&local_e8);
  if (iVar3 < 3) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  pFVar1 = this->options_;
  local_160 = (pFVar1->FluctuatingChargeEnergyUnitScaling).data_;
  this->eus_ = local_160;
  local_168 = (pFVar1->ChargeUnitScaling).data_;
  this->cus_ = local_168;
  this->dus_ = (pFVar1->DistanceUnitScaling).data_;
  this->oss_ = (pFVar1->OxidationStateScaling).data_;
  StringTokenizer::nextToken_abi_cxx11_(&local_108,&local_e8);
  local_158 = ForceField::getAtomType(ff,&local_108);
  if (local_158 == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n"
             ,local_108._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_150._0_8_ = local_158;
    bVar2 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)local_150);
    if (!bVar2) {
      FixedChargeAdapter::makeFixedCharge((FixedChargeAdapter *)local_150,0.0);
    }
  }
  local_140._32_8_ = StringTokenizer::nextTokenAsDouble(&local_e8);
  StringTokenizer::nextToken_abi_cxx11_((string *)local_150,&local_e8);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
          ::find(&(this->stringToEnumMap_)._M_t,(key_type *)local_150);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) {
    _Var6 = 4;
  }
  else {
    _Var6 = iVar4._M_node[2]._M_color;
  }
  if ((AtomType *)local_150._0_8_ != (AtomType *)local_140) {
    operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
  }
  if (_Var6 == _S_red) {
    if (6 < iVar3) {
      local_170 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_178 = StringTokenizer::nextTokenAsDouble(&local_e8);
      iVar3 = StringTokenizer::nextTokenAsInt(&local_e8);
      RVar8 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_150._0_8_ = local_158;
      FluctuatingChargeAdapter::makeFluctuatingCharge
                ((FluctuatingChargeAdapter *)local_150,(RealType)local_140._32_8_,
                 (local_160 / local_168) * local_170,
                 (local_160 / (local_168 * local_168)) * local_178,iVar3,RVar8 / this->dus_);
      goto LAB_00193aec;
    }
LAB_00193ab5:
    __format = "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n";
LAB_00193ac5:
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    if (_Var6 == _S_black) {
      if ((iVar3 - 3U & 1) == 0 || iVar3 < 6) goto LAB_00193ab5;
      local_178 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_140._8_8_ = local_150 + 8;
      local_150._8_4_ = _S_red;
      local_140._0_8_ = (_func_int **)0x0;
      local_140._24_8_ = (pointer)0x0;
      uVar7 = iVar3 - 4U >> 1;
      local_140._16_8_ = local_140._8_8_;
      do {
        iVar3 = StringTokenizer::nextTokenAsInt(&local_e8);
        local_160 = StringTokenizer::nextTokenAsDouble(&local_e8);
        local_168 = this->eus_;
        local_170 = pow(this->cus_,(double)iVar3);
        local_180.at_._0_4_ = iVar3;
        pmVar5 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)local_150,(key_type *)&local_180);
        *pmVar5 = (local_160 * local_168) / local_170;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      local_180.at_ = local_158;
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_60,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)local_150);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (&local_180,(RealType)local_140._32_8_,local_178,(DoublePolynomial *)&local_60);
      this_00 = &local_60;
    }
    else {
      if (_Var6 != 2) {
        __format = 
        "FluctuatingChargeAtomTypesSectionParser Error: Unknown Fluctuating Charge Type at line %d\n"
        ;
        goto LAB_00193ac5;
      }
      if ((iVar3 - 3U & 1) != 0 || iVar3 < 6) goto LAB_00193ab5;
      RVar8 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_140._48_8_ = RVar8 * this->oss_;
      RVar8 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_140._40_8_ = RVar8 * this->oss_;
      local_140._8_8_ = local_150 + 8;
      local_150._8_4_ = _S_red;
      local_140._0_8_ = (_func_int **)0x0;
      local_140._24_8_ = (pointer)0x0;
      local_140._16_8_ = local_140._8_8_;
      if (1 < iVar3 - 5U) {
        uVar7 = iVar3 - 5U >> 1;
        do {
          iVar3 = StringTokenizer::nextTokenAsInt(&local_e8);
          local_160 = this->oss_;
          local_168 = StringTokenizer::nextTokenAsDouble(&local_e8);
          local_170 = this->eus_;
          local_178 = pow(this->oss_ * this->cus_,(double)iVar3);
          local_180.at_._0_4_ = iVar3;
          pmVar5 = std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                 *)local_150,(key_type *)&local_180);
          *pmVar5 = (local_160 * local_160 * local_168 * local_170) / local_178;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      local_180.at_ = local_158;
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)local_150);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (&local_180,(RealType)local_140._32_8_,(RealType)local_140._48_8_,
                 (RealType)local_140._40_8_,(DoublePolynomial *)&local_90);
      this_00 = &local_90;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(this_00);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)local_150);
  }
LAB_00193aec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.delim_._M_dataplus._M_p != &local_e8.delim_.field_2) {
    operator_delete(local_e8.delim_._M_dataplus._M_p,
                    local_e8.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.tokenString_._M_dataplus._M_p != &local_e8.tokenString_.field_2) {
    operator_delete(local_e8.tokenString_._M_dataplus._M_p,
                    local_e8.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FluctuatingChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                                          const string& line,
                                                          int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    // conversion to kcal / mol
    eus_ = options_.getFluctuatingChargeEnergyUnitScaling();
    // conversion to electrons
    cus_ = options_.getChargeUnitScaling();
    // conversion to angstroms
    dus_ = options_.getDistanceUnitScaling();
    // oxidation state scaling
    oss_ = options_.getOxidationStateScaling();

    // electronegativity conversion
    RealType chius = eus_ / cus_;
    // curvature (hardness) conversion
    RealType curvus = eus_ / (cus_ * cus_);

    string atomTypeName = tokenizer.nextToken();
    AtomType* atomType  = ff.getAtomType(atomTypeName);
    if (atomType != NULL) {
      FixedChargeAdapter fca = FixedChargeAdapter(atomType);

      // All fluctuating charges are charges, and if we haven't
      // already set values for the charge, then start with zero.
      if (!fca.isFixedCharge()) {
        RealType charge = 0.0;
        fca.makeFixedCharge(charge);
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] "
               "has not been created yet\n",
               atomTypeName.c_str());
      painCave.isFatal = 1;
      simError();
    }

    RealType chargeMass     = tokenizer.nextTokenAsDouble();
    FluctuatingTypeEnum fqt = getFluctuatingTypeEnum(tokenizer.nextToken());

    nTokens -= 3;

    switch (fqt) {
    case fqtHardness:
      // For Rick, Stuart, Berne style fluctuating charges, there's a
      // self charge potential defined by electronegativity and
      // hardness. On molecular structures, the slater-type overlap
      // integral is used to compute the hardness.

      // atomTypeName, chargeMass, Hardness, electronegativity,
      //   hardness (Jii), slaterN, slaterZeta

      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType chi        = chius * tokenizer.nextTokenAsDouble();
        RealType Jii        = curvus * tokenizer.nextTokenAsDouble();
        int slaterN         = tokenizer.nextTokenAsInt();
        RealType slaterZeta = tokenizer.nextTokenAsDouble() / dus_;

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, chi, Jii, slaterN, slaterZeta);
      }
      break;

    case fqtEAMPolynomial:

      // For DR-EAM v1, oxidation state scaling is built in to
      // fluctuating charge parameters and nValence.

      if (nTokens < 3 || nTokens % 2 != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType nValence = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ / pow(cus_, power);
          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, nValence, vself);
      }
      break;

    case fqtDREAM2:

      // For DR-EAM v2, oxidation state scaling (oss_) is a force
      // field parameter, fluctuating charge parameters, nValence, and
      // nMobile in the force field file should assume unit charge
      // oxidation state fits to ionization states and electron
      // affinities.

      if (nTokens < 3 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        // Neutral atom valence count
        RealType nValence = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;
        // Mobile electron count
        RealType nMobile = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = oss_ * oss_ * tokenizer.nextTokenAsDouble() * eus_ /
                        pow(oss_ * cus_, power);

          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

        fqa.makeFluctuatingCharge(chargeMass, nValence, nMobile, vself);
      }
      break;

    case fqtUnknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Unknown Fluctuating Charge Type at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      break;
    }
  }